

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

void __thiscall
helics::CommsInterface::setCallback
          (CommsInterface *this,function<void_(helics::ActionMessage_&&)> *callback)

{
  bool bVar1;
  CommsInterface *in_RSI;
  CommsInterface *in_RDI;
  function<void_(helics::ActionMessage_&&)> *unaff_retaddr;
  
  bVar1 = propertyLock(in_RDI);
  if (bVar1) {
    std::function<void_(helics::ActionMessage_&&)>::operator=
              (unaff_retaddr,(function<void_(helics::ActionMessage_&&)> *)in_RDI);
    propertyUnLock(in_RSI);
  }
  return;
}

Assistant:

void CommsInterface::setCallback(std::function<void(ActionMessage&&)> callback)
{
    if (propertyLock()) {
        ActionCallback = std::move(callback);
        propertyUnLock();
    }
}